

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int jumponcond(FuncState *fs,expdesc *e,int cond)

{
  uint uVar1;
  Instruction ie;
  int cond_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  if ((e->k == VRELOCABLE) && (uVar1 = fs->f->code[(e->u).info], (uVar1 & 0x3f) == 0x1b)) {
    fs->pc = fs->pc + -1;
    fs_local._4_4_ = condjump(fs,OP_TEST,uVar1 >> 0x17,0,(uint)((cond != 0 ^ 0xffU) & 1));
  }
  else {
    discharge2anyreg(fs,e);
    freeexp(fs,e);
    fs_local._4_4_ = condjump(fs,OP_TESTSET,0xff,(e->u).info,cond);
  }
  return fs_local._4_4_;
}

Assistant:

static int jumponcond (FuncState *fs, expdesc *e, int cond) {
  if (e->k == VRELOCABLE) {
    Instruction ie = getinstruction(fs, e);
    if (GET_OPCODE(ie) == OP_NOT) {
      fs->pc--;  /* remove previous OP_NOT */
      return condjump(fs, OP_TEST, GETARG_B(ie), 0, !cond);
    }
    /* else go through */
  }
  discharge2anyreg(fs, e);
  freeexp(fs, e);
  return condjump(fs, OP_TESTSET, NO_REG, e->u.info, cond);
}